

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedVarint<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  string *psVar4;
  ulong uVar5;
  LogMessageFatal local_40 [16];
  
  uVar5 = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((uVar5 & 3) != 0) {
    AlignFail();
  }
  if (((ulong)data.field_0 & 7) != 0) {
    if ((data.field_0._0_4_ & 7) == 2) {
      pcVar3 = MpPackedVarint<true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar3;
    }
    pcVar3 = (*table->fallback)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar3;
  }
  uVar1 = *(ushort *)(uVar5 + 10);
  uVar2 = uVar1 >> 6 & 7;
  if ((uVar1 >> 6 & 7) == 0) {
    pcVar3 = MpRepeatedVarintT<true,bool,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  if (uVar2 != 2) {
    if (uVar2 != 3) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x7dc);
    }
    if ((uVar1 & 0x600) != 0) {
      if ((uVar1 & 0x600) == 0x200) {
        psVar4 = (string *)0x0;
      }
      else {
        psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)(uVar1 & 0x600),0x200,"xform_val == +field_layout::kTvZigZag");
      }
      if (psVar4 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7be,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      }
    }
    pcVar3 = MpRepeatedVarintT<true,unsigned_long,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits)
    ;
    return pcVar3;
  }
  pcVar3 = MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits);
  return pcVar3;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedVarint(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const auto type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const auto decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  // For split we avoid the duplicate code and have the impl reload the value.
  // Less code bloat for uncommon paths.
  const uint16_t xform_val = (type_card & field_layout::kTvMask);
  const uint16_t rep = type_card & field_layout::kRepMask;
  switch (rep >> field_layout::kRepShift) {
    case field_layout::kRep64Bits >> field_layout::kRepShift:
      if (xform_val == 0) {
        PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, uint64_t, 0>(
            PROTOBUF_TC_PARAM_PASS);
      } else {
        ABSL_DCHECK_EQ(xform_val, +field_layout::kTvZigZag);
        PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
            is_split, uint64_t, (is_split ? 0 : field_layout::kTvZigZag)>(
            PROTOBUF_TC_PARAM_PASS);
      }
    case field_layout::kRep32Bits >> field_layout::kRepShift:
      switch (xform_val >> field_layout::kTvShift) {
        case 0:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, uint32_t, 0>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvZigZag >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvZigZag)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvEnum >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvEnum)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvRange >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvRange)>(
              PROTOBUF_TC_PARAM_PASS);
        default:
          Unreachable();
      }
    case field_layout::kRep8Bits >> field_layout::kRepShift:
      PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, bool, 0>(
          PROTOBUF_TC_PARAM_PASS);

    default:
      Unreachable();
      return nullptr;  // To silence -Werror=return-type in some toolchains
  }
}